

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

void __thiscall
CppGenerator::createRelationSortingOrder(CppGenerator *this,TDNode *node,size_t *parent_id)

{
  size_t relationID;
  size_t **ppsVar1;
  TDNode *node_00;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong local_48 [4];
  
  if (node->_numOfNeighbors != 0) {
    uVar4 = 0;
    do {
      relationID = (node->_neighbors).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4];
      if (relationID != *parent_id) {
        node_00 = TreeDecomposition::getRelation
                            ((this->_td).
                             super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,relationID);
        local_48[2] = (node_00->_bag).super__Base_bitset<2UL>._M_w[0] &
                      (node->_bag).super__Base_bitset<2UL>._M_w[0];
        local_48[3] = (node_00->_bag).super__Base_bitset<2UL>._M_w[1] &
                      (node->_bag).super__Base_bitset<2UL>._M_w[1];
        ppsVar1 = this->sortOrders;
        uVar3 = 0;
        lVar2 = 0;
        do {
          if ((local_48[(uVar3 >> 6) + 2] >> (uVar3 & 0x3f) & 1) != 0) {
            ppsVar1[node_00->_id][lVar2] = uVar3;
            lVar2 = lVar2 + 1;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != 100);
        local_48[0] = (node_00->_bag).super__Base_bitset<2UL>._M_w[0] &
                      ((node->_bag).super__Base_bitset<2UL>._M_w[0] ^ 0xffffffffffffffff);
        local_48[1] = (node_00->_bag).super__Base_bitset<2UL>._M_w[1] &
                      ((node->_bag).super__Base_bitset<2UL>._M_w[1] ^ 0xffffffffffffffff) &
                      (ulong)DAT_002b26a0;
        ppsVar1 = this->sortOrders;
        uVar3 = 0;
        do {
          if ((local_48[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0) {
            ppsVar1[node_00->_id][lVar2] = uVar3;
            lVar2 = lVar2 + 1;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != 100);
        createRelationSortingOrder(this,node_00,&node->_id);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < node->_numOfNeighbors);
  }
  return;
}

Assistant:

void CppGenerator::createRelationSortingOrder(TDNode* node, const size_t& parent_id)
{
    // get intersection with parent Node node
    for (size_t neigh = 0; neigh < node->_numOfNeighbors; ++neigh)
    {
        if (node->_neighbors[neigh] != parent_id)
        {
            TDNode* neighbor = _td->getRelation(node->_neighbors[neigh]);
            const size_t& neighID = neighbor->_id;
            
            var_bitset interaction = node->_bag & neighbor->_bag;
            
            size_t orderIdx = 0;
            for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
            {
                if (interaction[var])
                {
                    // add to sort order
                    sortOrders[neighID][orderIdx] = var;
                    ++orderIdx;
                }
            }

            var_bitset additionalVars =  ~node->_bag & neighbor->_bag;
            for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
            {
                if (additionalVars[var])
                {
                    // add to sort order
                    sortOrders[neighID][orderIdx] = var;
                    ++orderIdx;
                }
            } 
            createRelationSortingOrder(neighbor, node->_id);
        }
    }
}